

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convex_hull.cpp
# Opt level: O0

vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
* ear::convex_hull(vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   *__return_storage_ptr__,
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *positions,double tolerance)

{
  size_t sVar1;
  Vec *pVVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  double dVar7;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *pMVar8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar9;
  Vec *pVVar10;
  reference this;
  reference pvVar11;
  reference pvVar12;
  reference piVar13;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  *this_00;
  RealScalar RVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar15 [16];
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar16;
  value_type_conflict local_2ac;
  value_type_conflict5 local_2a8;
  size_t corner_idx_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  Facet f;
  value_type_conflict local_244;
  value_type_conflict5 local_240;
  size_t corner_idx;
  iterator __end4_1;
  iterator __begin4_1;
  value_type *__range4_1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_208;
  _Rb_tree_const_iterator<int> local_1f0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_1e8;
  Vec *facet_point;
  Vec *facet_norm;
  size_t facet_i;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMStack_1c8;
  bool found_facet;
  Vec *tri_norm;
  Vec *tri_point;
  size_t tri_i;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  hull_facet_normals;
  value_type local_190;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_178;
  ReturnType local_160;
  double dot_point;
  Matrix<double,_3,_1,_0,_3,_1> *pos_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *__range4;
  undefined1 local_130 [7];
  bool points_on_same_side_as_inside;
  ReturnType local_118;
  double dot_inside;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_e8;
  undefined1 local_d0 [8];
  Vec normal;
  size_t k;
  size_t j;
  size_t i;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  hull_tri_normals;
  vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> hull_tris
  ;
  Matrix<double,_3,_1,_0,_3,_1> *pos;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *__range1;
  Matrix<double,3,1,0,3,1> local_38 [8];
  Vec inside_point;
  double tolerance_local;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *positions_local;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *hull_facets;
  
  inside_point.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = tolerance;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_38,(EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&__range1);
  __end1 = std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::begin(positions);
  pos = (Matrix<double,_3,_1,_0,_3,_1> *)
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::end(positions);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                     *)&pos), bVar4) {
    pMVar9 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             __gnu_cxx::
             __normal_iterator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
             ::operator*(&__end1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_38,pMVar9);
    __gnu_cxx::
    __normal_iterator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
    ::operator++(&__end1);
  }
  sVar6 = std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size(positions);
  auVar15._8_4_ = (int)(sVar6 >> 0x20);
  auVar15._0_8_ = sVar6;
  auVar15._12_4_ = 0x45300000;
  hull_tris.
  super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((auVar15._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_38,
             (Scalar *)
             &hull_tris.
              super__Vector_base<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>::
  vector((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_> *
         )&hull_tri_normals.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&i);
  for (j = 0; sVar6 = std::
                      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ::size(positions), sVar1 = j, j < sVar6; j = j + 1) {
    while( true ) {
      k = sVar1 + 1;
      sVar6 = std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::size(positions);
      if (sVar6 <= k) break;
      for (normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] = (double)(sVar1 + 2);
          dVar3 = normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2],
          dVar7 = (double)std::
                          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ::size(positions), sVar1 = k, (ulong)dVar3 < (ulong)dVar7;
          normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] = (double)((long)normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2] + 1)) {
        pMVar8 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 std::
                 vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ::operator[](positions,k);
        pMVar9 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 std::
                 vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ::operator[](positions,j);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(&local_e8,pMVar8,pMVar9);
        pMVar8 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 std::
                 vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ::operator[](positions,
                              (size_type)
                              normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[2]);
        pMVar9 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 std::
                 vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ::operator[](positions,j);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&dot_inside,pMVar8,pMVar9);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
        ::
        cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  ((type *)local_d0,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                    *)&local_e8,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)&dot_inside);
        RVar14 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::squaredNorm
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d0);
        _assert_impl(inside_point.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] < RVar14,"collinear points in convex hull");
        Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_d0);
        pMVar9 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 std::
                 vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ::operator[](positions,j);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_130,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_38,pMVar9);
        pMVar8 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d0;
        local_118 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                    dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                              (pMVar8,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)local_130);
        std::abs((int)pMVar8);
        if (inside_point.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[2] <= extraout_XMM0_Qa) {
          bVar4 = true;
          __end4 = std::
                   vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ::begin(positions);
          pos_1 = (Matrix<double,_3,_1,_0,_3,_1> *)
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::end(positions);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                             *)&pos_1), bVar5) {
            pMVar8 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                     __gnu_cxx::
                     __normal_iterator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                     ::operator*(&__end4);
            dot_point = (double)pMVar8;
            pMVar9 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     std::
                     vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ::operator[](positions,j);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(&local_178,pMVar8,pMVar9);
            local_160 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                        dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                                  ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d0,
                                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    *)&local_178);
            if (local_118 <= 0.0) {
              if (inside_point.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2] <= local_160) goto LAB_00254f72;
            }
            else if (local_160 <=
                     -inside_point.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2]) {
LAB_00254f72:
              bVar4 = false;
              break;
            }
            __gnu_cxx::
            __normal_iterator<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
            ::operator++(&__end4);
          }
          if (bVar4) {
            local_190._M_elems[0] = j;
            local_190._M_elems[1] = k;
            local_190._M_elems[2] =
                 (unsigned_long)
                 normal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
            std::
            vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
            ::push_back((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                         *)&hull_tri_normals.
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_190);
            std::
            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)&i,(value_type *)local_d0);
          }
        }
      }
    }
  }
  hull_facet_normals.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&tri_i);
  tri_point = (Vec *)0x0;
  do {
    pVVar2 = tri_point;
    pVVar10 = (Vec *)std::
                     vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                     ::size((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                             *)&hull_tri_normals.
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pVVar10 <= pVVar2) {
      hull_facet_normals.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&tri_i);
      if ((hull_facet_normals.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::
        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::~vector(__return_storage_ptr__);
      }
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&i);
      std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
      ::~vector((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                 *)&hull_tri_normals.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    this = std::
           vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
           ::operator[]((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                         *)&hull_tri_normals.
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)tri_point)
    ;
    pvVar11 = std::array<unsigned_long,_3UL>::operator[](this,0);
    tri_norm = std::
               vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ::operator[](positions,*pvVar11);
    pMStack_1c8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                *)&i,(size_type)tri_point);
    facet_i._7_1_ = 0;
    facet_norm = (Vec *)0x0;
    while( true ) {
      pVVar2 = facet_norm;
      pVVar10 = (Vec *)std::
                       vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ::size(__return_storage_ptr__);
      if (pVVar10 <= pVVar2) goto LAB_00255357;
      facet_point = std::
                    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  *)&tri_i,(size_type)facet_norm);
      pvVar12 = std::
                vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ::operator[](__return_storage_ptr__,(size_type)facet_norm);
      local_1f0._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pvVar12);
      piVar13 = std::_Rb_tree_const_iterator<int>::operator*(&local_1f0);
      local_1e8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::operator[](positions,(long)*piVar13);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                (&local_208,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)tri_norm,local_1e8);
      this_00 = &local_208;
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::dot<Eigen::Matrix<double,3,1,0,3,1>>
                ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  *)this_00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)facet_point);
      std::abs((int)this_00);
      bVar4 = false;
      if (extraout_XMM0_Qa_00 <
          inside_point.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2]) {
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                  ((type *)&__range4_1,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)facet_point,
                   pMStack_1c8);
        RVar14 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::squaredNorm
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&__range4_1);
        bVar4 = RVar14 < inside_point.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[2];
      }
      if (bVar4) break;
      facet_norm = (Vec *)((long)(facet_norm->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data.array + 1);
    }
    __begin4_1 = std::
                 vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                 ::operator[]((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                               *)&hull_tri_normals.
                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (size_type)tri_point)->_M_elems;
    __end4_1 = std::array<unsigned_long,_3UL>::begin((array<unsigned_long,_3UL> *)__begin4_1);
    corner_idx = (size_t)std::array<unsigned_long,_3UL>::end
                                   ((array<unsigned_long,_3UL> *)__begin4_1);
    for (; __end4_1 != (iterator)corner_idx; __end4_1 = __end4_1 + 1) {
      local_240 = *__end4_1;
      pvVar12 = std::
                vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ::operator[](__return_storage_ptr__,(size_type)facet_norm);
      local_244 = (value_type_conflict)local_240;
      pVar16 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pvVar12,&local_244);
      f._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar16.first._M_node;
    }
    facet_i._7_1_ = 1;
LAB_00255357:
    if ((facet_i._7_1_ & 1) == 0) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range3);
      __begin3 = std::
                 vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                 ::operator[]((vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>
                               *)&hull_tri_normals.
                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (size_type)tri_point)->_M_elems;
      __end3 = std::array<unsigned_long,_3UL>::begin((array<unsigned_long,_3UL> *)__begin3);
      corner_idx_1 = (size_t)std::array<unsigned_long,_3UL>::end
                                       ((array<unsigned_long,_3UL> *)__begin3);
      for (; __end3 != (iterator)corner_idx_1; __end3 = __end3 + 1) {
        local_2a8 = *__end3;
        local_2ac = (value_type_conflict)local_2a8;
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range3,&local_2ac);
      }
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&__range3);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)&tri_i,(value_type *)pMStack_1c8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range3);
    }
    tri_point = (Vec *)((long)(tri_point->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                              m_storage.m_data.array + 1);
  } while( true );
}

Assistant:

std::vector<Facet> convex_hull(const std::vector<Eigen::Vector3d> &positions,
                                 double tolerance) {
    using Vec = Eigen::Vector3d;
    using Tri = std::array<size_t, 3>;

    // the mean point, guaranteed to be inside the convex hull
    Vec inside_point = Vec::Zero();
    for (auto &pos : positions) inside_point += pos;
    inside_point /= (double)positions.size();

    // find all triangles on the convex hull:
    // - iterate through all possible triangles
    // - find the triangle normal, checking for collinearity
    // - it's on the convex hull if:
    //    - the inside point is not on the plane of the triangle
    //    - all points are on the same side of the plane of the triangle as the
    //    inside point
    std::vector<Tri> hull_tris;
    std::vector<Vec> hull_tri_normals;

    for (size_t i = 0; i < positions.size(); i++)
      for (size_t j = i + 1; j < positions.size(); j++)
        for (size_t k = j + 1; k < positions.size(); k++) {
          Vec normal =
              (positions[j] - positions[i]).cross(positions[k] - positions[i]);
          ear_assert(normal.squaredNorm() > tolerance,
                     "collinear points in convex hull");
          normal.normalize();  // XXX: not really required, but helps make
                               // tolerances consistent

          double dot_inside = normal.dot(inside_point - positions[i]);

          if (std::abs(dot_inside) < tolerance)
            continue;  // tri coplanar with inside point

          bool points_on_same_side_as_inside = true;
          for (auto &pos : positions) {
            double dot_point = normal.dot(pos - positions[i]);

            // check if signs are equal, with tolerance
            if (!(dot_inside > 0 ? dot_point > -tolerance
                                 : dot_point < tolerance)) {
              points_on_same_side_as_inside = false;
              break;
            }
          }

          if (points_on_same_side_as_inside) {
            hull_tris.push_back({i, j, k});
            hull_tri_normals.push_back(normal);
          }
        }

    // merge coplanar triangles into facets
    std::vector<Facet> hull_facets;
    std::vector<Vec> hull_facet_normals;

    for (size_t tri_i = 0; tri_i < hull_tris.size(); tri_i++) {
      const Vec &tri_point = positions[hull_tris[tri_i][0]];
      const Vec &tri_norm = hull_tri_normals[tri_i];

      // check each facet to see if this triangle is on the same plane.
      // if it is, add the points to the facet. if no facet is found, make a
      // new facet.
      bool found_facet = false;
      for (size_t facet_i = 0; facet_i < hull_facets.size(); facet_i++) {
        const Vec &facet_norm = hull_facet_normals[facet_i];
        const Vec &facet_point = positions[*hull_facets[facet_i].begin()];

        // they are on the same plane if the line between the test points is
        // not along the normal, and if the normals point in the same or
        // opposite direction. alternatively, we could just test all tri
        // vertices.
        if (std::abs((tri_point - facet_point).dot(facet_norm)) < tolerance &&
            facet_norm.cross(tri_norm).squaredNorm() < tolerance) {
          for (size_t corner_idx : hull_tris[tri_i]) {
            hull_facets[facet_i].insert((Facet::value_type)corner_idx);
          }

          found_facet = true;
          break;
        }
      }

      if (!found_facet) {
        Facet f;
        for (size_t corner_idx : hull_tris[tri_i])
          f.insert((Facet::value_type)corner_idx);
        hull_facets.push_back(std::move(f));
        hull_facet_normals.push_back(tri_norm);
      }
    }

    return hull_facets;
  }